

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<sisl::cartesian_cubic<float>*>::convert<sisl::cartesian_cubic<float>>
          (string *__return_storage_ptr__,StringMaker<sisl::cartesian_cubic<float>*> *this,
          cartesian_cubic<float> *p)

{
  ostringstream oss;
  ostringstream local_190 [376];
  
  if (this == (StringMaker<sisl::cartesian_cubic<float>*> *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"__null",(allocator *)local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<void_const*>(local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( U* p ) {
        if( !p )
            return INTERNAL_CATCH_STRINGIFY( NULL );
        std::ostringstream oss;
        oss << p;
        return oss.str();
    }